

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

size_t __thiscall
libtorrent::aux::utp_socket_impl::write_some(utp_socket_impl *this,bool clear_buffers)

{
  bool bVar1;
  bool clear_buffers_local;
  utp_socket_impl *this_local;
  
  this->m_written = 0;
  do {
    bVar1 = send_pkt(this,0);
  } while (bVar1);
  if (clear_buffers) {
    this->m_write_buffer_size = 0;
    ::std::vector<libtorrent::span<const_char>,_std::allocator<libtorrent::span<const_char>_>_>::
    clear(&this->m_write_buffer);
  }
  return (long)this->m_written;
}

Assistant:

std::size_t utp_socket_impl::write_some(bool const clear_buffers)
{
	m_written = 0;

	// try to write if the congestion window allows it
	while (send_pkt());

	if (clear_buffers)
	{
		m_write_buffer_size = 0;
		m_write_buffer.clear();
	}

	return std::size_t(m_written);
}